

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_compute_utt(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 win,mfcc_t ***feat)

{
  mfcc_t **ppmVar1;
  long lVar2;
  
  ppmVar1 = mfc + win;
  for (lVar2 = 0; lVar2 + win < (long)(nfr - win); lVar2 = lVar2 + 1) {
    (*fcb->compute_feat)(fcb,ppmVar1,feat[lVar2]);
    ppmVar1 = ppmVar1 + 1;
  }
  if (fcb->lda != (mfcc_t ***)0x0) {
    feat_lda_transform(fcb,feat,nfr + win * -2);
  }
  if (fcb->subvecs != (int32 **)0x0) {
    feat_subvec_project(fcb,feat,nfr + win * -2);
    return;
  }
  return;
}

Assistant:

static void
feat_compute_utt(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 win, mfcc_t ***feat)
{
    int32 i;

    cep_dump_dbg(fcb, mfc, nfr, "Incoming features (after padding)");

    /* Create feature vectors */
    for (i = win; i < nfr - win; i++) {
        fcb->compute_feat(fcb, mfc + i, feat[i - win]);
    }

    feat_print_dbg(fcb, feat, nfr - win * 2, "After dynamic feature computation");

    if (fcb->lda) {
        feat_lda_transform(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After LDA");
    }

    if (fcb->subvecs) {
        feat_subvec_project(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After subvector projection");
    }
}